

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O1

TSmallArrayVector * __thiscall
glslang::TSmallArrayVector::operator=(TSmallArrayVector *this,TSmallArrayVector *from)

{
  if (from->sizes == (TVector<glslang::TArraySize> *)0x0) {
    this->sizes = (TVector<glslang::TArraySize> *)0x0;
  }
  else {
    alloc(this);
    std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::operator=
              (&this->sizes->
                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>,
               &from->sizes->
                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>);
  }
  return this;
}

Assistant:

TSmallArrayVector& operator=(const TSmallArrayVector& from)
    {
        if (from.sizes == nullptr)
            sizes = nullptr;
        else {
            alloc();
            *sizes = *from.sizes;
        }

        return *this;
    }